

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_striped_sse41_128_32.c
# Opt level: O2

parasail_result_t *
parasail_nw_stats_table_striped_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  undefined1 (*pauVar1) [12];
  int *piVar2;
  uint *puVar3;
  undefined4 uVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  void *pvVar7;
  void *pvVar8;
  int iVar9;
  undefined1 auVar10 [12];
  uint uVar11;
  int iVar12;
  uint uVar13;
  undefined4 extraout_EAX;
  parasail_result_t *ppVar14;
  __m128i *palVar15;
  __m128i *palVar16;
  __m128i *ptr;
  __m128i *palVar17;
  __m128i *ptr_00;
  __m128i *b;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  int32_t *ptr_03;
  uint uVar18;
  int iVar19;
  size_t len;
  char *pcVar20;
  undefined8 extraout_RDX;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  ulong uVar21;
  __m128i *ptr_04;
  int32_t t;
  __m128i *ptr_05;
  char *__format;
  int iVar22;
  __m128i *ptr_06;
  int iVar23;
  __m128i *ptr_07;
  long lVar24;
  long lVar25;
  ulong uVar26;
  ulong size;
  int iVar27;
  uint uVar28;
  int iVar29;
  ulong uVar30;
  int iVar37;
  undefined1 auVar31 [16];
  int iVar36;
  undefined1 auVar32 [16];
  int iVar38;
  int iVar39;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  __m128i alVar35;
  int32_t iVar40;
  uint uVar41;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  undefined1 auVar42 [16];
  int iVar50;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  __m128i alVar46;
  uint uVar51;
  uint uVar55;
  uint uVar56;
  undefined1 auVar52 [16];
  uint uVar58;
  undefined1 auVar53 [16];
  long lVar57;
  __m128i alVar54;
  ulong uVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  long lVar63;
  __m128i alVar62;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  int iVar69;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  uint uVar70;
  uint uVar71;
  uint uVar72;
  uint uVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  int iVar80;
  int iVar83;
  int iVar84;
  int iVar85;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i vH;
  __m128i vH_00;
  __m128i vH_01;
  __m128i vH_02;
  __m128i vH_03;
  __m128i vH_04;
  __m128i vH_05;
  __m128i vH_06;
  int32_t in_stack_fffffffffffffd68;
  __m128i *local_288;
  uint local_218;
  uint uStack_214;
  uint uStack_210;
  uint uStack_20c;
  uint local_208;
  uint uStack_204;
  uint uStack_200;
  uint uStack_1fc;
  int local_188;
  int iStack_184;
  int iStack_180;
  int iStack_17c;
  int local_118;
  int iStack_114;
  int iStack_110;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  __m128i_32_t e;
  __m128i_32_t h;
  longlong extraout_RDX_00;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar20 = "profile";
  }
  else {
    pvVar5 = (profile->profile32).score;
    if (pvVar5 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar20 = "profile->profile32.score";
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar20 = "profile->matrix";
      }
      else {
        uVar18 = profile->s1Len;
        if ((int)uVar18 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar20 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar20 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar20 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar20 = "open";
        }
        else {
          if (-1 < gap) {
            uVar28 = uVar18 - 1;
            size = (ulong)uVar18 + 3 >> 2;
            uVar30 = (ulong)uVar28 % size;
            iVar27 = -open;
            iVar22 = ppVar6->min;
            uVar13 = 0x80000000 - iVar22;
            if (iVar22 != iVar27 && SBORROW4(iVar22,iVar27) == iVar22 + open < 0) {
              uVar13 = open | 0x80000000;
            }
            pvVar7 = (profile->profile32).matches;
            uVar11 = 0x7ffffffe - ppVar6->max;
            pvVar8 = (profile->profile32).similar;
            uVar18 = (uint)((ulong)uVar18 + 3) & 0x7ffffffc;
            uVar21 = (ulong)uVar18;
            ppVar14 = parasail_result_new_table3(uVar18,s2Len);
            if (ppVar14 != (parasail_result_t *)0x0) {
              ppVar14->flag = ppVar14->flag | 0x4430801;
              local_288 = parasail_memalign___m128i(0x10,size);
              palVar15 = parasail_memalign___m128i(0x10,size);
              palVar16 = parasail_memalign___m128i(0x10,size);
              ptr = parasail_memalign___m128i(0x10,size);
              palVar17 = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign___m128i(0x10,size);
              b = parasail_memalign___m128i(0x10,size);
              ptr_01 = parasail_memalign___m128i(0x10,size);
              ptr_02 = parasail_memalign___m128i(0x10,size);
              b_00 = parasail_memalign___m128i(0x10,size);
              b_01 = parasail_memalign___m128i(0x10,size);
              b_02 = parasail_memalign___m128i(0x10,size);
              ptr_03 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
              len = CONCAT71((int7)(uVar21 >> 8),ptr_02 == (__m128i *)0x0);
              c[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
              c[1]._0_1_ = b_01 == (__m128i *)0x0;
              auVar31._0_8_ = -(ulong)(local_288 == (__m128i *)0x0);
              auVar31._8_8_ = -(ulong)(palVar15 == (__m128i *)0x0);
              auVar52._0_8_ = -(ulong)(palVar16 == (__m128i *)0x0);
              auVar52._8_8_ = -(ulong)(ptr == (__m128i *)0x0);
              auVar31 = packssdw(auVar31,auVar52);
              auVar76._0_8_ = -(ulong)(palVar17 == (__m128i *)0x0);
              auVar76._8_8_ = -(ulong)(ptr_00 == (__m128i *)0x0);
              auVar86._0_8_ = -(ulong)(b == (__m128i *)0x0);
              auVar86._8_8_ = -(ulong)(ptr_01 == (__m128i *)0x0);
              auVar52 = packssdw(auVar76,auVar86);
              auVar31 = packssdw(auVar31,auVar52);
              if (((((b_00 != (__m128i *)0x0 && ptr_02 != (__m128i *)0x0) && b_01 != (__m128i *)0x0)
                   && b_02 != (__m128i *)0x0) && ptr_03 != (int32_t *)0x0) &&
                  ((((((((((((((((auVar31 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                                (auVar31 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar31 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar31 >> 0x1f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar31 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar31 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar31 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar31 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar31 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar31 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar31 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar31 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar31 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar31 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar31 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar31[0xf])) {
                iVar12 = s2Len + -1;
                uVar13 = uVar13 + 1;
                c[0] = size;
                parasail_memset___m128i(palVar16,c,len);
                c_00[1] = extraout_RDX_00;
                c_00[0] = size;
                parasail_memset___m128i(palVar17,c_00,len);
                c_01[1] = extraout_RDX_01;
                c_01[0] = size;
                parasail_memset___m128i(b,c_01,len);
                c_02[1] = extraout_RDX_02;
                c_02[0] = size;
                parasail_memset___m128i(b_00,c_02,len);
                c_03[1] = extraout_RDX_03;
                c_03[0] = size;
                parasail_memset___m128i(b_01,c_03,len);
                c_04[1] = extraout_RDX_04;
                c_04[0] = size;
                parasail_memset___m128i(b_02,c_04,len);
                iVar19 = (int)size;
                iVar22 = iVar27;
                for (uVar21 = 0; uVar21 != size; uVar21 = uVar21 + 1) {
                  iVar23 = iVar22;
                  for (lVar24 = 0; lVar24 != 4; lVar24 = lVar24 + 1) {
                    lVar25 = (long)iVar23 - (ulong)(uint)open;
                    if (lVar25 < -0x7fffffff) {
                      lVar25 = -0x80000000;
                    }
                    *(int *)((long)&h + lVar24 * 4) = iVar23;
                    *(int *)((long)&e + lVar24 * 4) = (int)lVar25;
                    iVar23 = iVar23 - gap * iVar19;
                  }
                  local_288[uVar21][0] = h.m[0];
                  local_288[uVar21][1] = h.m[1];
                  ptr_02[uVar21][0] = e.m[0];
                  ptr_02[uVar21][1] = e.m[1];
                  iVar22 = iVar22 - gap;
                }
                *ptr_03 = 0;
                for (uVar21 = 1; s2Len + 1 != uVar21; uVar21 = uVar21 + 1) {
                  ptr_03[uVar21] = iVar27;
                  iVar27 = iVar27 - gap;
                }
                uVar18 = iVar19 - 1;
                uVar21 = 0;
                local_218 = uVar11;
                uStack_214 = uVar11;
                uStack_210 = uVar11;
                uStack_20c = uVar11;
                local_208 = uVar13;
                uStack_204 = uVar13;
                uStack_200 = uVar13;
                uStack_1fc = uVar13;
                do {
                  ptr_07 = palVar15;
                  ptr_06 = b;
                  ptr_05 = palVar17;
                  ptr_04 = palVar16;
                  if (uVar21 == (uint)s2Len) {
                    alVar35 = local_288[uVar30];
                    alVar46 = ptr_04[uVar30];
                    alVar54 = ptr_05[uVar30];
                    alVar62 = ptr_06[uVar30];
                    iVar22 = 0;
                    while( true ) {
                      uVar30 = alVar35[0];
                      lVar24 = alVar35[1];
                      uVar21 = alVar46[0];
                      lVar25 = alVar46[1];
                      uVar26 = alVar54[0];
                      lVar57 = alVar54[1];
                      uVar59 = alVar62[0];
                      lVar63 = alVar62[1];
                      if (3 - (int)(uVar28 / size) <= iVar22) break;
                      alVar35[0] = uVar30 << 0x20;
                      alVar35[1] = lVar24 << 0x20 | uVar30 >> 0x20;
                      alVar46[0] = uVar21 << 0x20;
                      alVar46[1] = lVar25 << 0x20 | uVar21 >> 0x20;
                      alVar54[0] = uVar26 << 0x20;
                      alVar54[1] = lVar57 << 0x20 | uVar26 >> 0x20;
                      alVar62[0] = uVar59 << 0x20;
                      alVar62[1] = lVar63 << 0x20 | uVar59 >> 0x20;
                      iVar22 = iVar22 + 1;
                    }
                    auVar66._0_4_ = -(uint)((int)local_218 < (int)uVar13);
                    auVar66._4_4_ = -(uint)((int)uStack_214 < (int)uVar13);
                    auVar66._8_4_ = -(uint)((int)uStack_210 < (int)uVar13);
                    auVar66._12_4_ = -(uint)((int)uStack_20c < (int)uVar13);
                    auVar68._0_4_ = -(uint)((int)uVar11 < (int)local_208);
                    auVar68._4_4_ = -(uint)((int)uVar11 < (int)uStack_204);
                    auVar68._8_4_ = -(uint)((int)uVar11 < (int)uStack_200);
                    auVar68._12_4_ = -(uint)((int)uVar11 < (int)uStack_1fc);
                    iVar22 = movmskps(iVar22,auVar68 | auVar66);
                    if (iVar22 == 0) {
                      iVar22 = alVar35[1]._4_4_;
                      iVar27 = alVar46[1]._4_4_;
                      iVar19 = alVar54[1]._4_4_;
                      iVar23 = alVar62[1]._4_4_;
                    }
                    else {
                      *(byte *)&ppVar14->flag = (byte)ppVar14->flag | 0x40;
                      iVar22 = 0;
                      iVar27 = 0;
                      iVar19 = 0;
                      iVar23 = 0;
                      iVar12 = 0;
                      uVar28 = 0;
                    }
                    ppVar14->score = iVar22;
                    ppVar14->end_query = uVar28;
                    ppVar14->end_ref = iVar12;
                    ((ppVar14->field_4).stats)->matches = iVar27;
                    ((ppVar14->field_4).stats)->similar = iVar19;
                    ((ppVar14->field_4).stats)->length = iVar23;
                    parasail_free(ptr_03);
                    parasail_free(b_02);
                    parasail_free(b_01);
                    parasail_free(b_00);
                    parasail_free(ptr_02);
                    parasail_free(ptr_01);
                    parasail_free(ptr_06);
                    parasail_free(ptr_00);
                    parasail_free(ptr_05);
                    parasail_free(ptr);
                    parasail_free(ptr_04);
                    parasail_free(ptr_07);
                    parasail_free(local_288);
                    return ppVar14;
                  }
                  palVar16 = local_288 + uVar18;
                  palVar17 = ptr_04 + uVar18;
                  iVar84 = (int)(*palVar17)[0];
                  iVar85 = *(int *)((long)*palVar17 + 4);
                  iVar69 = (int)(*palVar17)[1];
                  palVar17 = ptr_05 + uVar18;
                  iVar36 = (int)(*palVar17)[0];
                  iVar37 = *(int *)((long)*palVar17 + 4);
                  iVar80 = (int)(*palVar17)[1];
                  uVar26 = ptr_06[uVar18][0];
                  iVar83 = 0;
                  iVar29 = 0;
                  palVar17 = local_288 + uVar18;
                  iVar22 = (int)(*palVar17)[0];
                  iVar27 = *(int *)((long)*palVar17 + 4);
                  iVar23 = (int)(*palVar17)[1];
                  iVar40 = ptr_03[uVar21];
                  auVar60._0_8_ = uVar26 << 0x20;
                  auVar60._8_8_ = ptr_06[uVar18][1] << 0x20 | uVar26 >> 0x20;
                  lVar24 = (long)(ppVar6->mapper[(byte)s2[uVar21]] * iVar19) * 0x10;
                  auVar74 = ZEXT816(0);
                  uVar26 = 0;
                  auVar67._4_4_ = uVar13;
                  auVar67._0_4_ = uVar13;
                  auVar67._8_4_ = uVar13;
                  auVar67._12_4_ = uVar13;
                  auVar75 = ZEXT816(0);
                  palVar17 = palVar16;
                  auVar78 = _DAT_008a1fe0;
                  for (lVar25 = 0; t = (int32_t)uVar21, size << 4 != lVar25; lVar25 = lVar25 + 0x10)
                  {
                    pauVar1 = (undefined1 (*) [12])((long)*ptr_02 + lVar25);
                    iVar38 = *(int *)*pauVar1;
                    iVar39 = *(int *)(*pauVar1 + 4);
                    iVar9 = *(int *)(*pauVar1 + 8);
                    auVar10 = *pauVar1;
                    iVar50 = *(int *)pauVar1[1];
                    auVar31 = *(undefined1 (*) [16])((long)*b_00 + lVar25);
                    auVar52 = *(undefined1 (*) [16])((long)*b_01 + lVar25);
                    auVar76 = *(undefined1 (*) [16])((long)*b_02 + lVar25);
                    piVar2 = (int *)((long)pvVar5 + lVar25 + lVar24);
                    uVar41 = iVar40 + *piVar2;
                    uVar47 = iVar22 + piVar2[1];
                    uVar48 = iVar27 + piVar2[2];
                    uVar49 = iVar23 + piVar2[3];
                    uVar51 = (uint)((int)uVar41 < iVar38) * iVar38 |
                             ((int)uVar41 >= iVar38) * uVar41;
                    uVar55 = (uint)((int)uVar47 < iVar39) * iVar39 |
                             ((int)uVar47 >= iVar39) * uVar47;
                    uVar56 = (uint)((int)uVar48 < iVar9) * iVar9 | ((int)uVar48 >= iVar9) * uVar48;
                    uVar58 = (uint)((int)uVar49 < iVar50) * iVar50 |
                             ((int)uVar49 >= iVar50) * uVar49;
                    iVar22 = auVar67._0_4_;
                    uVar70 = (uint)((int)uVar51 < iVar22) * iVar22 |
                             ((int)uVar51 >= iVar22) * uVar51;
                    iVar23 = auVar67._4_4_;
                    uVar71 = (uint)((int)uVar55 < iVar23) * iVar23 |
                             ((int)uVar55 >= iVar23) * uVar55;
                    iVar38 = auVar67._8_4_;
                    uVar72 = (uint)((int)uVar56 < iVar38) * iVar38 |
                             ((int)uVar56 >= iVar38) * uVar56;
                    iVar39 = auVar67._12_4_;
                    uVar73 = (uint)((int)uVar58 < iVar39) * iVar39 |
                             ((int)uVar58 >= iVar39) * uVar58;
                    puVar3 = (uint *)((long)*ptr_07 + lVar25);
                    *puVar3 = uVar70;
                    puVar3[1] = uVar71;
                    puVar3[2] = uVar72;
                    puVar3[3] = uVar73;
                    auVar53._0_4_ = -(uint)(iVar22 < (int)uVar51);
                    auVar53._4_4_ = -(uint)(iVar23 < (int)uVar55);
                    auVar53._8_4_ = -(uint)(iVar38 < (int)uVar56);
                    auVar53._12_4_ = -(uint)(iVar39 < (int)uVar58);
                    auVar86 = blendvps(auVar74,auVar31,auVar53);
                    piVar2 = (int *)((long)pvVar7 + lVar25 + lVar24);
                    auVar87._0_4_ = iVar83 + *piVar2;
                    auVar87._4_4_ = iVar84 + piVar2[1];
                    auVar87._8_4_ = iVar85 + piVar2[2];
                    auVar87._12_4_ = iVar69 + piVar2[3];
                    auVar42._0_4_ = -(uint)(uVar41 == uVar70);
                    auVar42._4_4_ = -(uint)(uVar47 == uVar71);
                    auVar42._8_4_ = -(uint)(uVar48 == uVar72);
                    auVar42._12_4_ = -(uint)(uVar49 == uVar73);
                    auVar87 = blendvps(auVar86,auVar87,auVar42);
                    *(undefined1 (*) [16])((long)*ptr + lVar25) = auVar87;
                    auVar86 = blendvps(auVar75,auVar52,auVar53);
                    piVar2 = (int *)((long)pvVar8 + lVar25 + lVar24);
                    auVar64._0_4_ = iVar29 + *piVar2;
                    auVar64._4_4_ = iVar36 + piVar2[1];
                    auVar64._8_4_ = iVar37 + piVar2[2];
                    auVar64._12_4_ = iVar80 + piVar2[3];
                    auVar67 = blendvps(auVar86,auVar64,auVar42);
                    auVar86 = blendvps(auVar78,auVar76,auVar53);
                    auVar61._0_4_ = auVar60._0_4_ + 1;
                    auVar61._4_4_ = auVar60._4_4_ + 1;
                    auVar61._8_4_ = auVar60._8_4_ + 1;
                    auVar61._12_4_ = auVar60._12_4_ + 1;
                    auVar86 = blendvps(auVar86,auVar61,auVar42);
                    uVar41 = ((int)local_208 < (int)uVar70) * uVar70 |
                             ((int)local_208 >= (int)uVar70) * local_208;
                    uVar47 = ((int)uStack_204 < (int)uVar71) * uVar71 |
                             ((int)uStack_204 >= (int)uVar71) * uStack_204;
                    uVar48 = ((int)uStack_200 < (int)uVar72) * uVar72 |
                             ((int)uStack_200 >= (int)uVar72) * uStack_200;
                    uVar49 = ((int)uStack_1fc < (int)uVar73) * uVar73 |
                             ((int)uStack_1fc >= (int)uVar73) * uStack_1fc;
                    iVar27 = auVar87._0_4_;
                    uVar51 = (uint)((int)uVar41 < iVar27) * iVar27 |
                             ((int)uVar41 >= iVar27) * uVar41;
                    iVar27 = auVar87._4_4_;
                    uVar55 = (uint)((int)uVar47 < iVar27) * iVar27 |
                             ((int)uVar47 >= iVar27) * uVar47;
                    iVar27 = auVar87._8_4_;
                    uVar56 = (uint)((int)uVar48 < iVar27) * iVar27 |
                             ((int)uVar48 >= iVar27) * uVar48;
                    iVar27 = auVar87._12_4_;
                    uVar58 = (uint)((int)uVar49 < iVar27) * iVar27 |
                             ((int)uVar49 >= iVar27) * uVar49;
                    iVar27 = auVar86._0_4_;
                    iVar29 = auVar67._0_4_;
                    uVar41 = (uint)(iVar29 < iVar27) * iVar27 | (uint)(iVar29 >= iVar27) * iVar29;
                    iVar29 = auVar86._4_4_;
                    iVar36 = auVar67._4_4_;
                    uVar47 = (uint)(iVar36 < iVar29) * iVar29 | (uint)(iVar36 >= iVar29) * iVar36;
                    iVar36 = auVar86._8_4_;
                    iVar37 = auVar67._8_4_;
                    iVar80 = auVar67._12_4_;
                    uVar48 = (uint)(iVar37 < iVar36) * iVar36 | (uint)(iVar37 >= iVar36) * iVar37;
                    iVar37 = auVar86._12_4_;
                    uVar49 = (uint)(iVar80 < iVar37) * iVar37 | (uint)(iVar80 >= iVar37) * iVar80;
                    local_208 = ((int)uVar51 < (int)uVar41) * uVar41 |
                                ((int)uVar51 >= (int)uVar41) * uVar51;
                    uStack_204 = ((int)uVar55 < (int)uVar47) * uVar47 |
                                 ((int)uVar55 >= (int)uVar47) * uVar55;
                    uStack_200 = ((int)uVar56 < (int)uVar48) * uVar48 |
                                 ((int)uVar56 >= (int)uVar48) * uVar56;
                    uStack_1fc = ((int)uVar58 < (int)uVar49) * uVar49 |
                                 ((int)uVar58 >= (int)uVar49) * uVar58;
                    *(undefined1 (*) [16])((long)*ptr_00 + lVar25) = auVar67;
                    *(undefined1 (*) [16])((long)*ptr_01 + lVar25) = auVar86;
                    local_218 = ((int)uVar70 < (int)local_218) * uVar70 |
                                ((int)uVar70 >= (int)local_218) * local_218;
                    uStack_214 = ((int)uVar71 < (int)uStack_214) * uVar71 |
                                 ((int)uVar71 >= (int)uStack_214) * uStack_214;
                    uStack_210 = ((int)uVar72 < (int)uStack_210) * uVar72 |
                                 ((int)uVar72 >= (int)uStack_210) * uStack_210;
                    uStack_20c = ((int)uVar73 < (int)uStack_20c) * uVar73 |
                                 ((int)uVar73 >= (int)uStack_20c) * uStack_20c;
                    vH[1] = size;
                    vH[0] = uVar26;
                    arr_store_si128(*(int **)((long)((ppVar14->field_4).trace)->trace_del_table + 8)
                                    ,vH,t,s2Len,(int32_t)palVar17,in_stack_fffffffffffffd68);
                    vH_00[1] = size;
                    vH_00[0] = uVar26;
                    arr_store_si128(*(int **)((long)((ppVar14->field_4).trace)->trace_del_table +
                                             0x10),vH_00,t,s2Len,(int32_t)palVar17,
                                    in_stack_fffffffffffffd68);
                    vH_01[1] = size;
                    vH_01[0] = uVar26;
                    arr_store_si128(*(int **)((long)((ppVar14->field_4).trace)->trace_del_table +
                                             0x18),vH_01,t,s2Len,(int32_t)palVar17,
                                    in_stack_fffffffffffffd68);
                    vH_02[1] = size;
                    vH_02[0] = uVar26;
                    arr_store_si128(*((ppVar14->field_4).trace)->trace_del_table,vH_02,t,s2Len,
                                    (int32_t)palVar17,in_stack_fffffffffffffd68);
                    local_188 = auVar78._0_4_;
                    iStack_184 = auVar78._4_4_;
                    iStack_180 = auVar78._8_4_;
                    iStack_17c = auVar78._12_4_;
                    iVar80 = uVar70 - open;
                    iVar83 = uVar71 - open;
                    iVar84 = uVar72 - open;
                    iVar85 = uVar73 - open;
                    local_118 = auVar10._0_4_;
                    iStack_114 = auVar10._4_4_;
                    iStack_110 = auVar10._8_4_;
                    local_118 = local_118 - gap;
                    iStack_114 = iStack_114 - gap;
                    iStack_110 = iStack_110 - gap;
                    iVar50 = iVar50 - gap;
                    auVar32._0_4_ = -(uint)(local_118 < iVar80);
                    auVar32._4_4_ = -(uint)(iStack_114 < iVar83);
                    auVar32._8_4_ = -(uint)(iStack_110 < iVar84);
                    auVar32._12_4_ = -(uint)(iVar50 < iVar85);
                    auVar86 = blendvps(auVar31,auVar87,auVar32);
                    auVar31 = blendvps(auVar52,auVar67,auVar32);
                    local_78 = auVar76._0_4_;
                    iStack_74 = auVar76._4_4_;
                    iStack_70 = auVar76._8_4_;
                    iStack_6c = auVar76._12_4_;
                    auVar65._0_4_ = local_78 + 1;
                    auVar65._4_4_ = iStack_74 + 1;
                    auVar65._8_4_ = iStack_70 + 1;
                    auVar65._12_4_ = iStack_6c + 1;
                    auVar88._0_4_ = iVar27 + 1;
                    auVar88._4_4_ = iVar29 + 1;
                    auVar88._8_4_ = iVar36 + 1;
                    auVar88._12_4_ = iVar37 + 1;
                    auVar52 = blendvps(auVar65,auVar88,auVar32);
                    iVar22 = iVar22 - gap;
                    iVar23 = iVar23 - gap;
                    iVar38 = iVar38 - gap;
                    iVar39 = iVar39 - gap;
                    auVar81._0_4_ = -(uint)(iVar22 < iVar80);
                    auVar81._4_4_ = -(uint)(iVar23 < iVar83);
                    auVar81._8_4_ = -(uint)(iVar38 < iVar84);
                    auVar81._12_4_ = -(uint)(iVar39 < iVar85);
                    auVar74 = blendvps(auVar74,auVar87,auVar81);
                    auVar75 = blendvps(auVar75,auVar67,auVar81);
                    puVar3 = (uint *)((long)*ptr_02 + lVar25);
                    *puVar3 = (uint)(iVar80 < local_118) * local_118 |
                              (uint)(iVar80 >= local_118) * iVar80;
                    puVar3[1] = (uint)(iVar83 < iStack_114) * iStack_114 |
                                (uint)(iVar83 >= iStack_114) * iVar83;
                    puVar3[2] = (uint)(iVar84 < iStack_110) * iStack_110 |
                                (uint)(iVar84 >= iStack_110) * iVar84;
                    puVar3[3] = (uint)(iVar85 < iVar50) * iVar50 | (uint)(iVar85 >= iVar50) * iVar85
                    ;
                    *(undefined1 (*) [16])((long)*b_00 + lVar25) = auVar86;
                    *(undefined1 (*) [16])((long)*b_01 + lVar25) = auVar31;
                    *(undefined1 (*) [16])((long)*b_02 + lVar25) = auVar52;
                    auVar77._0_4_ = local_188 + 1;
                    auVar77._4_4_ = iStack_184 + 1;
                    auVar77._8_4_ = iStack_180 + 1;
                    auVar77._12_4_ = iStack_17c + 1;
                    auVar78 = blendvps(auVar77,auVar88,auVar81);
                    auVar67._0_4_ =
                         (uint)(iVar80 < iVar22) * iVar22 | (uint)(iVar80 >= iVar22) * iVar80;
                    auVar67._4_4_ =
                         (uint)(iVar83 < iVar23) * iVar23 | (uint)(iVar83 >= iVar23) * iVar83;
                    auVar67._8_4_ =
                         (uint)(iVar84 < iVar38) * iVar38 | (uint)(iVar84 >= iVar38) * iVar84;
                    auVar67._12_4_ =
                         (uint)(iVar85 < iVar39) * iVar39 | (uint)(iVar85 >= iVar39) * iVar85;
                    piVar2 = (int *)((long)*local_288 + lVar25);
                    iVar40 = *piVar2;
                    iVar22 = piVar2[1];
                    iVar27 = piVar2[2];
                    iVar23 = piVar2[3];
                    piVar2 = (int *)((long)*ptr_04 + lVar25);
                    iVar83 = *piVar2;
                    iVar84 = piVar2[1];
                    iVar85 = piVar2[2];
                    iVar69 = piVar2[3];
                    piVar2 = (int *)((long)*ptr_05 + lVar25);
                    iVar29 = *piVar2;
                    iVar36 = piVar2[1];
                    iVar37 = piVar2[2];
                    iVar80 = piVar2[3];
                    auVar60 = *(undefined1 (*) [16])((long)*ptr_06 + lVar25);
                    uVar26 = (ulong)((int)uVar26 + 1);
                  }
                  for (iVar22 = 0; iVar22 != 4; iVar22 = iVar22 + 1) {
                    lVar25 = auVar74._8_8_;
                    uVar26 = auVar74._0_8_;
                    auVar74._0_8_ = uVar26 << 0x20;
                    auVar74._8_8_ = lVar25 << 0x20 | uVar26 >> 0x20;
                    lVar25 = auVar75._8_8_;
                    uVar26 = auVar75._0_8_;
                    auVar75._0_8_ = uVar26 << 0x20;
                    auVar75._8_8_ = lVar25 << 0x20 | uVar26 >> 0x20;
                    uVar4 = (undefined4)(*palVar16)[0];
                    auVar43._4_4_ = uVar4;
                    auVar43._0_4_ = uVar4;
                    auVar43._8_4_ = *(undefined4 *)((long)*palVar16 + 4);
                    auVar43._12_4_ = (int)(*palVar16)[1];
                    auVar44._4_4_ = uVar4;
                    auVar44._0_4_ = ptr_03[uVar21];
                    auVar44._8_8_ = auVar43._8_8_;
                    auVar82._0_4_ = auVar67._0_4_;
                    auVar82._4_4_ = auVar82._0_4_;
                    auVar82._8_4_ = auVar67._4_4_;
                    auVar82._12_4_ = auVar67._8_4_;
                    auVar67._4_4_ = auVar82._0_4_;
                    auVar67._0_4_ = ptr_03[uVar21 + 1] - open;
                    auVar67._8_8_ = auVar82._8_8_;
                    auVar79._0_4_ = auVar78._0_4_;
                    auVar79._4_4_ = auVar79._0_4_;
                    auVar79._8_4_ = auVar78._4_4_;
                    auVar79._12_4_ = auVar78._8_4_;
                    auVar78._8_8_ = auVar79._8_8_;
                    auVar78._0_8_ = (ulong)auVar79._0_4_ << 0x20 | 1;
                    lVar25 = 0;
                    for (uVar26 = 0; size != uVar26; uVar26 = uVar26 + 1) {
                      piVar2 = (int *)((long)pvVar5 + lVar25 + lVar24);
                      iVar23 = *piVar2;
                      iVar80 = piVar2[1];
                      iVar83 = piVar2[2];
                      iVar84 = piVar2[3];
                      piVar2 = (int *)((long)*ptr_07 + lVar25);
                      iVar85 = *piVar2;
                      iVar69 = piVar2[1];
                      iVar38 = piVar2[2];
                      iVar39 = piVar2[3];
                      iVar27 = auVar67._0_4_;
                      uVar51 = (uint)(iVar85 < iVar27) * iVar27 | (uint)(iVar85 >= iVar27) * iVar85;
                      iVar29 = auVar67._4_4_;
                      uVar55 = (uint)(iVar69 < iVar29) * iVar29 | (uint)(iVar69 >= iVar29) * iVar69;
                      iVar36 = auVar67._8_4_;
                      uVar56 = (uint)(iVar38 < iVar36) * iVar36 | (uint)(iVar38 >= iVar36) * iVar38;
                      iVar37 = auVar67._12_4_;
                      uVar58 = (uint)(iVar39 < iVar37) * iVar37 | (uint)(iVar39 >= iVar37) * iVar39;
                      puVar3 = (uint *)((long)*ptr_07 + lVar25);
                      *puVar3 = uVar51;
                      puVar3[1] = uVar55;
                      puVar3[2] = uVar56;
                      puVar3[3] = uVar58;
                      auVar45._0_4_ = -(uint)(auVar44._0_4_ + iVar23 == uVar51);
                      auVar45._4_4_ = -(uint)(auVar44._4_4_ + iVar80 == uVar55);
                      auVar45._8_4_ = -(uint)(auVar44._8_4_ + iVar83 == uVar56);
                      auVar45._12_4_ = -(uint)(auVar44._12_4_ + iVar84 == uVar58);
                      auVar33._0_4_ = -(uint)(iVar27 < iVar85);
                      auVar33._4_4_ = -(uint)(iVar29 < iVar69);
                      auVar33._8_4_ = -(uint)(iVar36 < iVar38);
                      auVar33._12_4_ = -(uint)(iVar37 < iVar39);
                      auVar33 = auVar33 | auVar45;
                      auVar52 = blendvps(auVar74,*(undefined1 (*) [16])((long)*ptr + lVar25),auVar33
                                        );
                      *(undefined1 (*) [16])((long)*ptr + lVar25) = auVar52;
                      auVar76 = blendvps(auVar75,*(undefined1 (*) [16])((long)*ptr_00 + lVar25),
                                         auVar33);
                      *(undefined1 (*) [16])((long)*ptr_00 + lVar25) = auVar76;
                      auVar31 = blendvps(auVar78,*(undefined1 (*) [16])((long)*ptr_01 + lVar25),
                                         auVar33);
                      *(undefined1 (*) [16])((long)*ptr_01 + lVar25) = auVar31;
                      local_218 = ((int)uVar51 < (int)local_218) * uVar51 |
                                  ((int)uVar51 >= (int)local_218) * local_218;
                      uStack_214 = ((int)uVar55 < (int)uStack_214) * uVar55 |
                                   ((int)uVar55 >= (int)uStack_214) * uStack_214;
                      uStack_210 = ((int)uVar56 < (int)uStack_210) * uVar56 |
                                   ((int)uVar56 >= (int)uStack_210) * uStack_210;
                      uStack_20c = ((int)uVar58 < (int)uStack_20c) * uVar58 |
                                   ((int)uVar58 >= (int)uStack_20c) * uStack_20c;
                      uVar41 = ((int)local_208 < (int)uVar51) * uVar51 |
                               ((int)local_208 >= (int)uVar51) * local_208;
                      uVar47 = ((int)uStack_204 < (int)uVar55) * uVar55 |
                               ((int)uStack_204 >= (int)uVar55) * uStack_204;
                      uVar48 = ((int)uStack_200 < (int)uVar56) * uVar56 |
                               ((int)uStack_200 >= (int)uVar56) * uStack_200;
                      uVar49 = ((int)uStack_1fc < (int)uVar58) * uVar58 |
                               ((int)uStack_1fc >= (int)uVar58) * uStack_1fc;
                      iVar23 = auVar52._0_4_;
                      uVar41 = (uint)((int)uVar41 < iVar23) * iVar23 |
                               ((int)uVar41 >= iVar23) * uVar41;
                      iVar23 = auVar52._4_4_;
                      uVar47 = (uint)((int)uVar47 < iVar23) * iVar23 |
                               ((int)uVar47 >= iVar23) * uVar47;
                      iVar23 = auVar52._8_4_;
                      uVar48 = (uint)((int)uVar48 < iVar23) * iVar23 |
                               ((int)uVar48 >= iVar23) * uVar48;
                      iVar23 = auVar52._12_4_;
                      uVar49 = (uint)((int)uVar49 < iVar23) * iVar23 |
                               ((int)uVar49 >= iVar23) * uVar49;
                      iVar23 = auVar31._0_4_;
                      iVar80 = auVar76._0_4_;
                      uVar70 = (uint)(iVar80 < iVar23) * iVar23 | (uint)(iVar80 >= iVar23) * iVar80;
                      iVar23 = auVar31._4_4_;
                      iVar80 = auVar76._4_4_;
                      uVar71 = (uint)(iVar80 < iVar23) * iVar23 | (uint)(iVar80 >= iVar23) * iVar80;
                      iVar23 = auVar31._8_4_;
                      iVar80 = auVar76._8_4_;
                      iVar83 = auVar76._12_4_;
                      uVar72 = (uint)(iVar80 < iVar23) * iVar23 | (uint)(iVar80 >= iVar23) * iVar80;
                      iVar23 = auVar31._12_4_;
                      uVar73 = (uint)(iVar83 < iVar23) * iVar23 | (uint)(iVar83 >= iVar23) * iVar83;
                      local_208 = ((int)uVar70 < (int)uVar41) * uVar41 |
                                  ((int)uVar70 >= (int)uVar41) * uVar70;
                      uStack_204 = ((int)uVar71 < (int)uVar47) * uVar47 |
                                   ((int)uVar71 >= (int)uVar47) * uVar71;
                      uStack_200 = ((int)uVar72 < (int)uVar48) * uVar48 |
                                   ((int)uVar72 >= (int)uVar48) * uVar72;
                      uStack_1fc = ((int)uVar73 < (int)uVar49) * uVar49 |
                                   ((int)uVar73 >= (int)uVar49) * uVar73;
                      vH_03[0] = uVar26 & 0xffffffff;
                      vH_03[1] = size;
                      arr_store_si128(*(int **)((long)((ppVar14->field_4).trace)->trace_del_table +
                                               8),vH_03,t,s2Len,(int32_t)palVar17,
                                      in_stack_fffffffffffffd68);
                      vH_04[0] = uVar26 & 0xffffffff;
                      vH_04[1] = size;
                      arr_store_si128(*(int **)((long)((ppVar14->field_4).trace)->trace_del_table +
                                               0x10),vH_04,t,s2Len,(int32_t)palVar17,
                                      in_stack_fffffffffffffd68);
                      vH_05[0] = uVar26 & 0xffffffff;
                      vH_05[1] = size;
                      arr_store_si128(*(int **)((long)((ppVar14->field_4).trace)->trace_del_table +
                                               0x18),vH_05,t,s2Len,(int32_t)palVar17,
                                      in_stack_fffffffffffffd68);
                      vH_06[0] = uVar26 & 0xffffffff;
                      vH_06[1] = size;
                      arr_store_si128(*((ppVar14->field_4).trace)->trace_del_table,vH_06,t,s2Len,
                                      (int32_t)palVar17,in_stack_fffffffffffffd68);
                      auVar67._0_4_ = iVar27 - gap;
                      auVar67._4_4_ = iVar29 - gap;
                      auVar67._8_4_ = iVar36 - gap;
                      auVar67._12_4_ = iVar37 - gap;
                      auVar34._0_4_ = -(uint)((int)auVar67._0_4_ < (int)(uVar51 - open));
                      auVar34._4_4_ = -(uint)((int)auVar67._4_4_ < (int)(uVar55 - open));
                      auVar34._8_4_ = -(uint)((int)auVar67._8_4_ < (int)(uVar56 - open));
                      auVar34._12_4_ = -(uint)((int)auVar67._12_4_ < (int)(uVar58 - open));
                      iVar27 = movmskps(extraout_EAX,auVar34);
                      if (iVar27 == 0xf) goto LAB_006945cd;
                      auVar74 = blendvps(auVar74,auVar52,auVar34);
                      auVar75 = blendvps(auVar75,auVar76,auVar34);
                      auVar31 = blendvps(auVar78,auVar31,auVar34);
                      auVar78._0_4_ = auVar31._0_4_ + 1;
                      auVar78._4_4_ = auVar31._4_4_ + 1;
                      auVar78._8_4_ = auVar31._8_4_ + 1;
                      auVar78._12_4_ = auVar31._12_4_ + 1;
                      auVar44 = *(undefined1 (*) [16])((long)*local_288 + lVar25);
                      lVar25 = lVar25 + 0x10;
                    }
                  }
LAB_006945cd:
                  uVar21 = uVar21 + 1;
                  palVar16 = ptr;
                  palVar17 = ptr_00;
                  b = ptr_01;
                  palVar15 = local_288;
                  ptr_01 = ptr_06;
                  ptr = ptr_04;
                  ptr_00 = ptr_05;
                  local_288 = ptr_07;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar20 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_stats_table_striped_profile_sse41_128_32",pcVar20);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m128i*)profile->profile32.score;
    vProfileM = (__m128i*)profile->profile32.matches;
    vProfileS = (__m128i*)profile->profile32.similar;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi32(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    boundary  = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop.  */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 4);
        vHM = _mm_slli_si128(vHM, 4);
        vHS = _mm_slli_si128(vHS, 4);
        vHL = _mm_slli_si128(vHL, 4);

        /* insert upper boundary condition */
        vH = _mm_insert_epi32(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi32(vH_dag, vE);
            vH = _mm_max_epi32(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            case1 = _mm_cmpeq_epi32(vH, vH_dag);
            case2 = _mm_cmpeq_epi32(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi32(vHM, _mm_load_si128(vPM + i)),
                    case1);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi32(vHS, _mm_load_si128(vPS + i)),
                    case1);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi32(vHL, vOne),
                    case1);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm_sub_epi32(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi32(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_add_epi32(vEL, vOne),
                    _mm_add_epi32(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi32(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi32(vFL, vOne),
                    _mm_add_epi32(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            int64_t tmp = boundary[j+1]-open;
            int32_t tmp2 = tmp < INT32_MIN ? INT32_MIN : tmp;
            vHp = _mm_slli_si128(vHp, 4);
            vF = _mm_slli_si128(vF, 4);
            vFM = _mm_slli_si128(vFM, 4);
            vFS = _mm_slli_si128(vFS, 4);
            vFL = _mm_slli_si128(vFL, 4);
            vHp = _mm_insert_epi32(vHp, boundary[j], 0);
            vF = _mm_insert_epi32(vF, tmp2, 0);
            vFL = _mm_insert_epi32(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_add_epi32(vHp, _mm_load_si128(vP + i));
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi32(vH, vHp);
                case2 = _mm_cmpeq_epi32(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm_sub_epi32(vH, vGapO);
                vF_ext = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi32(vF_ext, vEF_opn),
                                _mm_cmpeq_epi32(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi32(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi32(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_add_epi32(vFL, vOne),
                        _mm_add_epi32(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128 (vH, 4);
                vHM = _mm_slli_si128 (vHM, 4);
                vHS = _mm_slli_si128 (vHS, 4);
                vHL = _mm_slli_si128 (vHL, 4);
            }
            result->stats->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
            result->stats->rowcols->matches_row[j] = (int32_t) _mm_extract_epi32 (vHM, 3);
            result->stats->rowcols->similar_row[j] = (int32_t) _mm_extract_epi32 (vHS, 3);
            result->stats->rowcols->length_row[j] = (int32_t) _mm_extract_epi32 (vHL, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        __m128i vHM = _mm_load_si128(pvHMStore + offset);
        __m128i vHS = _mm_load_si128(pvHSStore + offset);
        __m128i vHL = _mm_load_si128(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 4);
            vHM = _mm_slli_si128 (vHM, 4);
            vHS = _mm_slli_si128 (vHS, 4);
            vHL = _mm_slli_si128 (vHL, 4);
        }
        score = (int32_t) _mm_extract_epi32 (vH, 3);
        matches = (int32_t) _mm_extract_epi32 (vHM, 3);
        similar = (int32_t) _mm_extract_epi32 (vHS, 3);
        length = (int32_t) _mm_extract_epi32 (vHL, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}